

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_commit.cxx
# Opt level: O0

bool __thiscall
nuraft::raft_server::wait_for_state_machine_pause(raft_server *this,size_t timeout_ms)

{
  bool bVar1;
  atomic<bool> *in_RSI;
  EventAwaiter *in_RDI;
  size_t in_stack_ffffffffffffffd8;
  undefined1 local_1;
  
  EventAwaiter::reset((EventAwaiter *)0x23cfc4);
  bVar1 = std::atomic::operator_cast_to_bool(in_RSI);
  if (bVar1) {
    EventAwaiter::wait_ms(in_RDI,in_stack_ffffffffffffffd8);
    bVar1 = std::atomic::operator_cast_to_bool(in_RSI);
    if (bVar1) {
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool raft_server::wait_for_state_machine_pause(size_t timeout_ms) {
    ea_sm_commit_exec_in_progress_->reset();
    if (!sm_commit_exec_in_progress_) {
        return true;
    }
    ea_sm_commit_exec_in_progress_->wait_ms(timeout_ms);
    if (!sm_commit_exec_in_progress_) {
        return true;
    }
    return false;
}